

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O1

void headerJSON(FILE *stream,per_transfer *per)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 *local_38;
  
  fputc(0x7b,(FILE *)stream);
  local_38 = (undefined8 *)curl_easy_nextheader(per->curl,1,0xffffffff,0);
  if (local_38 != (undefined8 *)0x0) {
    puVar5 = (undefined8 *)0x0;
    do {
      uVar1 = local_38[2];
      if (uVar1 < 2) {
        if (puVar5 != (undefined8 *)0x0) {
          fputs(",\n",(FILE *)stream);
        }
        jsonWriteString(stream,(char *)*local_38,true);
        fputc(0x3a,(FILE *)stream);
        fputc(0x5b,(FILE *)stream);
        jsonWriteString(stream,(char *)local_38[1],false);
        fputc(0x5d,(FILE *)stream);
        puVar5 = local_38;
      }
      else if (local_38[3] == 0) {
        uVar2 = *local_38;
        if (puVar5 != (undefined8 *)0x0) {
          fputs(",\n",(FILE *)stream);
        }
        jsonWriteString(stream,(char *)*local_38,true);
        fputc(0x3a,(FILE *)stream);
        puVar5 = local_38;
        fputc(0x5b,(FILE *)stream);
        lVar4 = 1;
        do {
          jsonWriteString(stream,(char *)local_38[1],false);
          if (uVar1 + (uVar1 == 0) == lVar4) break;
          fputc(0x2c,(FILE *)stream);
          iVar3 = curl_easy_header(per->curl,uVar2,lVar4,1,0xffffffff,&local_38);
          lVar4 = lVar4 + 1;
        } while (iVar3 == 0);
        fputc(0x5d,(FILE *)stream);
      }
      local_38 = (undefined8 *)curl_easy_nextheader(per->curl,1,0xffffffff,puVar5);
    } while (local_38 != (undefined8 *)0x0);
  }
  fputs("\n}",(FILE *)stream);
  return;
}

Assistant:

void headerJSON(FILE *stream, struct per_transfer *per)
{
  struct curl_header *header;
  struct curl_header *prev = NULL;

  fputc('{', stream);
  while((header = curl_easy_nextheader(per->curl, CURLH_HEADER, -1,
                                       prev)) != NULL) {
    if(header->amount > 1) {
      if(!header->index) {
        /* act on the 0-index entry and pull the others in, then output in a
           JSON list */
        size_t a = header->amount;
        size_t i = 0;
        char *name = header->name;
        if(prev)
          fputs(",\n", stream);
        jsonWriteString(stream, header->name, TRUE);
        fputc(':', stream);
        prev = header;
        fputc('[', stream);
        do {
          jsonWriteString(stream, header->value, FALSE);
          if(++i >= a)
            break;
          fputc(',', stream);
          if(curl_easy_header(per->curl, name, i, CURLH_HEADER,
                              -1, &header))
            break;
        } while(1);
        fputc(']', stream);
      }
    }
    else {
      if(prev)
        fputs(",\n", stream);
      jsonWriteString(stream, header->name, TRUE);
      fputc(':', stream);
      fputc('[', stream);
      jsonWriteString(stream, header->value, FALSE);
      fputc(']', stream);
      prev = header;
    }
  }
  fputs("\n}", stream);
}